

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  int iVar1;
  int local_3c;
  int t;
  int dc;
  int diff;
  int b_local;
  stbi__huffman *hdc_local;
  short *data_local;
  stbi__jpeg *j_local;
  
  if (j->spec_end != 0) {
    iVar1 = stbi__err("Corrupt JPEG");
    return iVar1;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high == 0) {
    memset(data,0,0x80);
    iVar1 = stbi__jpeg_huff_decode(j,hdc);
    if ((iVar1 < 0) || (0xf < iVar1)) {
      iVar1 = stbi__err("Corrupt JPEG");
      return iVar1;
    }
    if (iVar1 == 0) {
      local_3c = 0;
    }
    else {
      local_3c = stbi__extend_receive(j,iVar1);
    }
    iVar1 = stbi__addints_valid(j->img_comp[b].dc_pred,local_3c);
    if (iVar1 == 0) {
      iVar1 = stbi__err("Corrupt JPEG");
      return iVar1;
    }
    local_3c = j->img_comp[b].dc_pred + local_3c;
    j->img_comp[b].dc_pred = local_3c;
    iVar1 = stbi__mul2shorts_valid(local_3c,1 << ((byte)j->succ_low & 0x1f));
    if (iVar1 == 0) {
      iVar1 = stbi__err("Corrupt JPEG");
      return iVar1;
    }
    *data = (short)local_3c * (short)(1 << ((byte)j->succ_low & 0x1f));
  }
  else {
    iVar1 = stbi__jpeg_get_bit(j);
    if (iVar1 != 0) {
      *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    }
  }
  return 1;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}